

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rehash.cpp
# Opt level: O1

bool Jupiter::removeOnRehash(OnRehashFunctionType in_function)

{
  long *plVar1;
  list<RehashFunction_*,_std::allocator<RehashFunction_*>_> *plVar2;
  
  plVar2 = &o_rehash_functions_abi_cxx11_;
  do {
    plVar2 = (list<RehashFunction_*,_std::allocator<RehashFunction_*>_> *)
             (plVar2->super__List_base<RehashFunction_*,_std::allocator<RehashFunction_*>_>)._M_impl
             ._M_node.super__List_node_base._M_next;
    if (plVar2 == &o_rehash_functions_abi_cxx11_) goto LAB_001371ef;
    plVar1 = *(long **)((long)plVar2 + 0x10);
  } while ((OnRehashFunctionType)plVar1[1] != in_function);
  if (plVar1 != (long *)0x0) {
    (**(code **)(*plVar1 + 0x18))(plVar1);
  }
  o_rehash_functions_abi_cxx11_.
  super__List_base<RehashFunction_*,_std::allocator<RehashFunction_*>_>._M_impl._M_node._M_size =
       o_rehash_functions_abi_cxx11_.
       super__List_base<RehashFunction_*,_std::allocator<RehashFunction_*>_>._M_impl._M_node._M_size
       - 1;
  std::__detail::_List_node_base::_M_unhook();
  operator_delete(plVar2,0x18);
LAB_001371ef:
  return plVar2 != &o_rehash_functions_abi_cxx11_;
}

Assistant:

bool Jupiter::removeOnRehash(OnRehashFunctionType in_function)
{
	for (auto node = o_rehash_functions.begin(); node != o_rehash_functions.end(); ++node)
	{
		if ((*node)->m_function == in_function)
		{
			delete *node;
			o_rehash_functions.erase(node);
			return true;
		}
	}

	return false;
}